

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.hpp
# Opt level: O3

void oqpi::posix_thread::set_core_affinity_mask
               (native_handle_type handle,core_affinity affinityMask)

{
  code *pcVar1;
  uint uVar2;
  uint32_t uVar3;
  eAssertResult eVar4;
  cpu_set_t local_98;
  
  local_98.__bits[1] = 0;
  local_98.__bits[0xe] = 0;
  local_98.__bits[0xf] = 0;
  local_98.__bits[0xc] = 0;
  local_98.__bits[0xd] = 0;
  local_98.__bits[10] = 0;
  local_98.__bits[0xb] = 0;
  local_98.__bits[8] = 0;
  local_98.__bits[9] = 0;
  local_98.__bits[6] = 0;
  local_98.__bits[7] = 0;
  local_98.__bits[4] = 0;
  local_98.__bits[5] = 0;
  local_98.__bits[2] = 0;
  local_98.__bits[3] = 0;
  local_98.__bits[0] = (__cpu_mask)affinityMask;
  if (!set_core_affinity_mask::always_ignore) {
    uVar3 = hardware_concurrency();
    if ((affinityMask != all_cores) && (affinityMask >> ((byte)uVar3 & 0x3f) != 0)) {
      eVar4 = assert_function("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/threading/posix_thread.hpp"
                              ,0x129,
                              "(static_cast<uint64_t>(affinityMask) < (1ull << hardware_concurrency()) || affinityMask == core_affinity::all_cores)"
                              ,"");
      if (eVar4 == eAR_AlwaysIgnore) {
        set_core_affinity_mask::always_ignore = true;
      }
      else if (eVar4 == eAR_Retry) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
  }
  uVar2 = pthread_setaffinity_np(handle,0x80,&local_98);
  if (uVar2 != 0) {
    fprintf(_stderr,"[error  ] pthread_setaffinity_np failed with error code %d\n",(ulong)uVar2);
  }
  return;
}

Assistant:

static void set_core_affinity_mask(native_handle_type handle, core_affinity affinityMask)
        {
            auto set = cpu_set_t{};
            // Clears set, so that it contains no CPUs.
            CPU_ZERO(&set);
            memcpy(&set.__bits, &affinityMask, sizeof(affinityMask));

            // Make sure the selected mask is valid
            oqpi_check(static_cast<uint64_t>(affinityMask) < (1ull << hardware_concurrency()) || affinityMask == core_affinity::all_cores);

            const auto error = pthread_setaffinity_np(handle, sizeof(cpu_set_t), &set);
            if(error != 0)
            {
                oqpi_error("pthread_setaffinity_np failed with error code %d", error);
            }
        }